

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::~CppCodeGenerator(CppCodeGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_003f2148;
  pcVar2 = (this->super_CodeGenerator).status_detail._M_dataplus._M_p;
  paVar1 = &(this->super_CodeGenerator).status_detail.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }